

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<64U,_29U,_buffer_layout_dfs>::operator()
          (fill<64U,_29U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  uchar *puVar1;
  int iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  uchar **ppuVar6;
  uchar **ppuVar7;
  long lVar8;
  size_t __n;
  unsigned_long *puVar9;
  size_t sVar10;
  fill<64U,_58U,_buffer_layout_dfs> local_64;
  fill<64U,_59U,_buffer_layout_dfs> local_63;
  fill<64U,_59U,_buffer_layout_dfs> local_62;
  fill<64U,_58U,_buffer_layout_dfs> local_61;
  uchar **begin;
  array<Stream,_64UL> *local_58;
  uchar **local_50;
  unsigned_long *local_48;
  unsigned_long *local_40;
  uchar **local_38;
  
  puVar5 = buffer_count->_M_elems + 0x3a;
  local_40 = buffer_count->_M_elems + 0x3b;
  local_50 = buffer + 0x1132;
  local_38 = buffer + 0x1149;
  begin = buffer + 0x112a;
  sVar10 = 0;
  lVar8 = 0;
  local_58 = streams;
  local_48 = puVar5;
  do {
    uVar3 = *puVar5;
    if (uVar3 == 0) {
      fill<64U,_58U,_buffer_layout_dfs>::operator()(&local_61,local_58,buffer,buffer_count);
      puVar5 = local_40;
      uVar3 = buffer_count->_M_elems[0x3a];
      if (uVar3 == 0) {
        uVar3 = *local_40;
        __n = -lVar8;
        lVar8 = -sVar10;
        break;
      }
    }
    puVar9 = local_40;
    uVar4 = *local_40;
    if (uVar4 == 0) {
      fill<64U,_59U,_buffer_layout_dfs>::operator()(&local_62,local_58,buffer,buffer_count);
      uVar3 = buffer_count->_M_elems[0x3a];
      uVar4 = buffer_count->_M_elems[0x3b];
      if (uVar4 == 0) {
        __n = -lVar8;
        lVar8 = -sVar10;
        puVar5 = local_48;
        goto LAB_0017bc62;
      }
    }
    ppuVar7 = local_50 + -uVar3 + 0x17;
    ppuVar6 = local_38 + -uVar4 + 0x17;
    iVar2 = cmp(buffer[-uVar3 + 0x1149],buffer[-uVar4 + 0x1160]);
    puVar5 = local_48;
    if (iVar2 < 1) {
      puVar9 = local_48;
      ppuVar6 = ppuVar7;
    }
    puVar1 = *ppuVar6;
    *puVar9 = *puVar9 - 1;
    buffer[sVar10 + 0x112a] = puVar1;
    check_input(begin,sVar10);
    lVar8 = lVar8 + -8;
    sVar10 = sVar10 + 1;
    if (sVar10 == 8) {
      buffer_count->_M_elems[0x1d] = 8;
      return;
    }
  } while( true );
  do {
    if (uVar3 == 0) {
      fill<64U,_59U,_buffer_layout_dfs>::operator()(&local_63,local_58,buffer,buffer_count);
      uVar3 = buffer_count->_M_elems[0x3b];
      if (uVar3 == 0) {
        ppuVar6 = (uchar **)((long)local_50 - __n);
        ppuVar7 = buffer + lVar8 + 0x1132;
        goto LAB_0017bced;
      }
    }
    *(uchar **)((long)buffer + __n + 0x8950) = buffer[0x1160 - uVar3];
    uVar3 = uVar3 - 1;
    *puVar5 = uVar3;
    lVar8 = lVar8 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
  goto LAB_0017bcb2;
LAB_0017bc62:
  do {
    if (uVar3 == 0) {
      fill<64U,_58U,_buffer_layout_dfs>::operator()(&local_64,local_58,buffer,buffer_count);
      uVar3 = buffer_count->_M_elems[0x3a];
      puVar5 = local_48;
      if (uVar3 == 0) {
        ppuVar7 = local_50 + lVar8;
        ppuVar6 = (uchar **)((long)local_50 - __n);
LAB_0017bced:
        sVar10 = -lVar8;
        memmove(ppuVar7,begin,__n);
        buffer_count->_M_elems[0x1d] = sVar10;
        goto LAB_0017bd0f;
      }
    }
    *(uchar **)((long)local_50 + (__n - 0x40)) = local_50[0x17 - uVar3];
    uVar3 = uVar3 - 1;
    *puVar5 = uVar3;
    lVar8 = lVar8 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
LAB_0017bcb2:
  buffer_count->_M_elems[0x1d] = 8;
  sVar10 = 8;
  ppuVar6 = begin;
LAB_0017bd0f:
  check_input(ppuVar6,sVar10);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}